

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,double v)

{
  enable_if_t<std::is_integral_v<long_long>,_bool> eVar1;
  Type TVar2;
  long in_FS_OFFSET;
  double dVar3;
  qint64 n;
  double local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0.0;
  eVar1 = anon_unknown.dwarf_a6f413::convertDoubleTo<long_long>(v,(longlong *)&local_20,false);
  dVar3 = local_20;
  if (!eVar1) {
    dVar3 = v;
  }
  TVar2 = Double;
  if (eVar1) {
    TVar2 = Integer;
  }
  (this->value).n = (qint64)dVar3;
  (this->value).container = (QCborContainerPrivate *)0x0;
  (this->value).t = TVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QJsonValue::QJsonValue(double v)
    : value(doubleValueHelper(v))
{
}